

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaQNameRefPtr
xmlSchemaParseAttributeGroupRef(xmlSchemaParserCtxtPtr pctxt,xmlSchemaPtr schema,xmlNodePtr node)

{
  xmlSchemaQNameRefPtr node_00;
  xmlSchemaPtr actxt;
  int iVar1;
  xmlChar *str1;
  xmlChar *local_58;
  xmlChar *str;
  xmlChar *ref;
  xmlChar *refNs;
  xmlAttrPtr attr;
  xmlNodePtr child;
  xmlSchemaQNameRefPtr ret;
  xmlNodePtr node_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  attr = (xmlAttrPtr)0x0;
  ref = (xmlChar *)0x0;
  str = (xmlChar *)0x0;
  if (((pctxt == (xmlSchemaParserCtxtPtr)0x0) || (schema == (xmlSchemaPtr)0x0)) ||
     (node == (xmlNodePtr)0x0)) {
    pctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    ret = (xmlSchemaQNameRefPtr)node;
    node_local = (xmlNodePtr)schema;
    schema_local = (xmlSchemaPtr)pctxt;
    refNs = (xmlChar *)xmlSchemaGetPropNode(node,"ref");
    if ((xmlAttrPtr)refNs == (xmlAttrPtr)0x0) {
      xmlSchemaPMissingAttrErr
                ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_MISSING,
                 (xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)ret,"ref",(char *)0x0);
      pctxt_local = (xmlSchemaParserCtxtPtr)0x0;
    }
    else {
      xmlSchemaPValAttrNodeQName
                ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                 (xmlSchemaBasicItemPtr)0x0,(xmlAttrPtr)refNs,&ref,&str);
      iVar1 = xmlSchemaCheckReference
                        ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                         (xmlNodePtr)ret,(xmlAttrPtr)refNs,ref);
      if (iVar1 == 0) {
        for (refNs = (xmlChar *)ret[1].node; refNs != (xmlChar *)0x0;
            refNs = *(xmlChar **)(refNs + 0x30)) {
          if (*(long *)(refNs + 0x48) == 0) {
            iVar1 = xmlStrEqual(*(xmlChar **)(refNs + 0x10),"ref");
            if ((iVar1 == 0) && (iVar1 = xmlStrEqual(*(xmlChar **)(refNs + 0x10),"id"), iVar1 == 0))
            {
              xmlSchemaPIllegalAttrErr
                        ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,
                         (xmlSchemaBasicItemPtr)0x0,(xmlAttrPtr)refNs);
            }
          }
          else {
            iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(refNs + 0x48) + 0x10),xmlSchemaNs);
            if (iVar1 != 0) {
              xmlSchemaPIllegalAttrErr
                        ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,
                         (xmlSchemaBasicItemPtr)0x0,(xmlAttrPtr)refNs);
            }
          }
        }
        xmlSchemaPValAttrID((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)ret,"id");
        attr = (xmlAttrPtr)ret->name;
        if (((attr != (xmlAttrPtr)0x0) && (attr->ns != (xmlNs *)0x0)) &&
           ((iVar1 = xmlStrEqual(attr->name,"annotation"), iVar1 != 0 &&
            (iVar1 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar1 != 0)))) {
          xmlSchemaParseAnnotation((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)attr,0);
          attr = attr->next;
        }
        if (attr != (xmlAttrPtr)0x0) {
          xmlSchemaPContentErr
                    ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
                     (xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)ret,(xmlNodePtr)attr,(char *)0x0,
                     "(annotation?)");
        }
        actxt = schema_local;
        node_00 = ret;
        if ((((*(int *)((long)&schema_local[1].id + 4) == 0) ||
             (schema_local[1].typeDecl == (xmlHashTablePtr)0x0)) ||
            (**(int **)&(schema_local[1].typeDecl)->size != 0x10)) ||
           (((_xmlHashEntry *)str != schema_local[1].typeDecl[1].table ||
            (ref != *(xmlChar **)&schema_local[1].typeDecl[1].size)))) {
          child = (xmlNodePtr)
                  xmlSchemaNewQNameRef
                            ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMA_TYPE_ATTRIBUTEGROUP,str
                             ,ref);
          if (child == (xmlNodePtr)0x0) {
            return (xmlSchemaQNameRefPtr)0x0;
          }
          child->parent = (_xmlNode *)ret;
          xmlSchemaAddItemSize
                    ((xmlSchemaItemListPtr *)(*(long *)&schema_local->flags + 0x28),10,child);
        }
        else {
          if (*(int *)&schema_local[1].attrDecl != 0) {
            local_58 = (xmlChar *)0x0;
            str1 = xmlSchemaFormatQName(&local_58,ref,str);
            xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)actxt,XML_SCHEMAP_SRC_REDEFINE,
                               (xmlNodePtr)node_00,(xmlSchemaBasicItemPtr)0x0,
                               "The redefining attribute group definition \'%s\' must not contain more than one reference to the redefined definition"
                               ,str1,(xmlChar *)0x0);
            if (local_58 != (xmlChar *)0x0) {
              (*xmlFree)(local_58);
            }
            return (xmlSchemaQNameRefPtr)0x0;
          }
          *(int *)&schema_local[1].attrDecl = *(int *)&schema_local[1].attrDecl + 1;
          child = (xmlNodePtr)
                  xmlSchemaNewQNameRef
                            ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMA_TYPE_ATTRIBUTEGROUP,str
                             ,ref);
          if (child == (xmlNodePtr)0x0) {
            return (xmlSchemaQNameRefPtr)0x0;
          }
          child->parent = (_xmlNode *)ret;
          (schema_local[1].typeDecl)->dict = (xmlDictPtr)child;
        }
        pctxt_local = (xmlSchemaParserCtxtPtr)child;
      }
      else {
        pctxt_local = (xmlSchemaParserCtxtPtr)0x0;
      }
    }
  }
  return (xmlSchemaQNameRefPtr)pctxt_local;
}

Assistant:

static xmlSchemaQNameRefPtr
xmlSchemaParseAttributeGroupRef(xmlSchemaParserCtxtPtr pctxt,
				xmlSchemaPtr schema,
				xmlNodePtr node)
{
    xmlSchemaQNameRefPtr ret;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;
    const xmlChar *refNs = NULL, *ref = NULL;

    if ((pctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    attr = xmlSchemaGetPropNode(node, "ref");
    if (attr == NULL) {
	xmlSchemaPMissingAttrErr(pctxt,
	    XML_SCHEMAP_S4S_ATTR_MISSING,
	    NULL, node, "ref", NULL);
	return (NULL);
    }
    xmlSchemaPValAttrNodeQName(pctxt, schema,
	NULL, attr, &refNs, &ref);
    if (xmlSchemaCheckReference(pctxt, schema, node, attr, refNs) != 0)
	return(NULL);

    /*
    * Check for illegal attributes.
    */
    attr = node->properties;
    while (attr != NULL) {
	if (attr->ns == NULL) {
	    if ((!xmlStrEqual(attr->name, BAD_CAST "ref")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "id")))
	    {
		xmlSchemaPIllegalAttrErr(pctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	} else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
	    xmlSchemaPIllegalAttrErr(pctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }
    /* Attribute ID */
    xmlSchemaPValAttrID(pctxt, node, BAD_CAST "id");

    /*
    * And now for the children...
    */
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
	/*
	* TODO: We do not have a place to store the annotation, do we?
	*/
        xmlSchemaParseAnnotation(pctxt, child, 0);
        child = child->next;
    }
    if (child != NULL) {
	xmlSchemaPContentErr(pctxt,
	    XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
	    NULL, node, child, NULL,
	    "(annotation?)");
    }

    /*
    * Handle attribute group redefinitions.
    */
    if (pctxt->isRedefine && pctxt->redef &&
	(pctxt->redef->item->type ==
	    XML_SCHEMA_TYPE_ATTRIBUTEGROUP) &&
	(ref == pctxt->redef->refName) &&
	(refNs == pctxt->redef->refTargetNs))
    {
	/*
	* SPEC src-redefine:
	* (7.1) "If it has an <attributeGroup> among its contents
	* the `actual value` of whose ref [attribute] is the same
	* as the `actual value` of its own name attribute plus
	* target namespace, then it must have exactly one such group."
	*/
	if (pctxt->redefCounter != 0) {
	    xmlChar *str = NULL;

	    xmlSchemaCustomErr(ACTXT_CAST pctxt,
		XML_SCHEMAP_SRC_REDEFINE, node, NULL,
		"The redefining attribute group definition "
		"'%s' must not contain more than one "
		"reference to the redefined definition",
		xmlSchemaFormatQName(&str, refNs, ref), NULL);
	    FREE_AND_NULL(str);
	    return(NULL);
	}
	pctxt->redefCounter++;
	/*
	* URGENT TODO: How to ensure that the reference will not be
	* handled by the normal component resolution mechanism?
	*/
	ret = xmlSchemaNewQNameRef(pctxt,
	    XML_SCHEMA_TYPE_ATTRIBUTEGROUP, ref, refNs);
	if (ret == NULL)
	    return(NULL);
	ret->node = node;
	pctxt->redef->reference = WXS_BASIC_CAST ret;
    } else {
	/*
	* Create a QName-reference helper component. We will substitute this
	* component for the attribute uses of the referenced attribute group
	* definition.
	*/
	ret = xmlSchemaNewQNameRef(pctxt,
	    XML_SCHEMA_TYPE_ATTRIBUTEGROUP, ref, refNs);
	if (ret == NULL)
	    return(NULL);
	ret->node = node;
	/* Add to pending items, to be able to resolve the reference. */
	WXS_ADD_PENDING(pctxt, ret);
    }
    return (ret);
}